

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_grab.cxx
# Opt level: O0

void Fl::grab(Fl_Window *win)

{
  uint uVar1;
  int iVar2;
  Fl_Window *pFVar3;
  Window local_30;
  Window xid;
  Fl_Window *W;
  Fl_Window *fullscreen_win;
  Fl_Window *win_local;
  
  W = (Fl_Window *)0x0;
  xid = (Window)first_window();
  do {
    if (xid == 0) {
LAB_002393ed:
      if (win == (Fl_Window *)0x0) {
        pFVar3 = grab_;
        if (grab_ != (Fl_Window *)0x0) {
          if ((W == (Fl_Window *)0x0) || (iVar2 = Fl_X::ewmh_supported(), iVar2 != 0)) {
            XUngrabKeyboard(fl_display,fl_event_time);
          }
          XUngrabPointer(fl_display,fl_event_time);
          XFlush(fl_display);
          grab_ = (Fl_Window *)0x0;
          fl_fix_focus();
          pFVar3 = grab_;
        }
      }
      else {
        pFVar3 = win;
        if (grab_ == (Fl_Window *)0x0) {
          if (W == (Fl_Window *)0x0) {
            pFVar3 = first_window();
            local_30 = fl_xid(pFVar3);
          }
          else {
            local_30 = fl_xid(W);
          }
          XGrabPointer(fl_display,local_30,1,0x204c,1,1,0,0,fl_event_time);
          XGrabKeyboard(fl_display,local_30,1,1,1,fl_event_time);
          pFVar3 = win;
        }
      }
      grab_ = pFVar3;
      return;
    }
    uVar1 = Fl_Window::fullscreen_active((Fl_Window *)xid);
    if (uVar1 != 0) {
      W = (Fl_Window *)xid;
      goto LAB_002393ed;
    }
    xid = (Window)next_window((Fl_Window *)xid);
  } while( true );
}

Assistant:

void Fl::grab(Fl_Window* win) {
#ifdef USE_X11
    Fl_Window *fullscreen_win = NULL;
    for (Fl_Window *W = Fl::first_window(); W; W = Fl::next_window(W)) {
      if (W->fullscreen_active()) {
        fullscreen_win = W;
        break;
      }
    }
#endif
  if (win) {
    if (!grab_) {
#ifdef WIN32
      SetActiveWindow(fl_capture = fl_xid(first_window()));
      SetCapture(fl_capture);
#elif defined(__APPLE__)
      fl_capture = Fl_X::i(first_window())->xid;
      Fl_X::i(first_window())->set_key_window();
#else
      Window xid = fullscreen_win ? fl_xid(fullscreen_win) : fl_xid(first_window());
      XGrabPointer(fl_display,
		   xid,
		   1,
		   ButtonPressMask|ButtonReleaseMask|
		   ButtonMotionMask|PointerMotionMask,
		   GrabModeAsync,
		   GrabModeAsync, 
		   None,
		   0,
		   fl_event_time);
      XGrabKeyboard(fl_display,
		    xid,
		    1,
		    GrabModeAsync,
		    GrabModeAsync, 
		    fl_event_time);
#endif
    }
    grab_ = win;
  } else {
    if (grab_) {
#ifdef WIN32
      fl_capture = 0;
      ReleaseCapture();
#elif defined(__APPLE__)
      fl_capture = 0;
#else
      // We must keep the grab in the non-EWMH fullscreen case
      if (!fullscreen_win || Fl_X::ewmh_supported()) {
      XUngrabKeyboard(fl_display, fl_event_time);
      }
      XUngrabPointer(fl_display, fl_event_time);
      // this flush is done in case the picked menu item goes into
      // an infinite loop, so we don't leave the X server locked up:
      XFlush(fl_display);
#endif
      grab_ = 0;
      fl_fix_focus();
    }
  }
}